

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void nni_sha1(void *msg,size_t length,uint8_t *digest)

{
  undefined1 auStack_80 [8];
  nni_sha1_ctx ctx;
  
  ctx.digest[4] = 0;
  ctx._20_4_ = 0;
  ctx.blk[0x38] = '\0';
  ctx.blk[0x39] = '\0';
  ctx.blk[0x3a] = '\0';
  ctx.blk[0x3b] = '\0';
  auStack_80._0_4_ = 0x67452301;
  auStack_80._4_4_ = 0xefcdab89;
  ctx.digest[0] = 0x98badcfe;
  ctx.digest[1] = 0x10325476;
  ctx.digest[2] = 0xc3d2e1f0;
  nni_sha1_update((nni_sha1_ctx *)auStack_80,msg,length);
  nni_sha1_final((nni_sha1_ctx *)auStack_80,digest);
  return;
}

Assistant:

void
nni_sha1(const void *msg, size_t length, uint8_t digest[20])
{
	nni_sha1_ctx ctx;

	nni_sha1_init(&ctx);
	nni_sha1_update(&ctx, msg, length);
	nni_sha1_final(&ctx, digest);
}